

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# levenberg_marquardt.cpp
# Opt level: O2

int __thiscall SimpleLineFunctor::operator()(SimpleLineFunctor *this,VectorXd *z,VectorXd *fvec)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  pointer pMVar5;
  uint uVar6;
  CoeffReturnType pdVar7;
  Scalar *pSVar8;
  ulong index;
  
  uVar6 = 0;
  while( true ) {
    index = (ulong)uVar6;
    pMVar5 = (this->Points).
             super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->Points).
                      super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar5 >> 4) <= index)
    break;
    dVar1 = pMVar5[index].super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.
            m_data.array[0];
    dVar2 = *(double *)
             ((long)&pMVar5[index].super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.
                     m_storage.m_data + 8);
    pdVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)z,0);
    dVar3 = *pdVar7;
    pdVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)z,1);
    dVar4 = *pdVar7;
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)fvec,index);
    *pSVar8 = dVar2 - (dVar1 * dVar3 + dVar4);
    uVar6 = uVar6 + 1;
  }
  return 0;
}

Assistant:

int operator()(const Eigen::VectorXd &z, Eigen::VectorXd &fvec) const
    {
        // "a" in the model is z(0), and "b" is z(1)
        double x_i,y_i,a,b;
        for(unsigned int i = 0; i < this->Points.size(); ++i)
        {
            y_i=this->Points[i](1);
            x_i=this->Points[i](0);
            a=z(0);
            b=z(1);
            fvec(i) =y_i-(a*x_i +b);
        }

        return 0;
    }